

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSBuilder::addTable(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  pointer puVar1;
  Table *pTVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  address64_t aVar8;
  pointer pNVar9;
  bool bVar10;
  Value *pVVar11;
  Ref RVar12;
  long lVar13;
  IString *this_00;
  Value *this_01;
  Ref obj;
  Value *pVVar14;
  undefined1 reuse;
  Ref in_RCX;
  char *pcVar15;
  void *pvVar16;
  Ref in_R8;
  Name *name;
  undefined1 auVar17 [8];
  pointer puVar18;
  ulong uVar19;
  string_view sVar20;
  Name name_00;
  IString target;
  IString target_00;
  Name name_01;
  IString name_02;
  IString op;
  IString op_00;
  undefined1 local_268 [8];
  FlatTable flat;
  string local_98;
  Wasm2JSBuilder *local_78;
  Value *local_70;
  Value *local_68;
  char *pcStack_60;
  Ref local_50;
  pointer local_48;
  Module *local_40;
  uint local_34;
  
  if ((wasm->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (wasm->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_78 = this;
    local_70 = ast.inst;
    local_40 = wasm;
    local_50 = cashew::ValueBuilder::makeArray();
    puVar18 = (local_40->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (local_40->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != puVar1) {
      local_34 = 0;
      do {
        bVar10 = wasm::Type::isFunction
                           (&((puVar18->_M_t).
                              super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
        if (!bVar10) {
          Fatal::Fatal((Fatal *)local_268);
          Fatal::operator<<((Fatal *)local_268,
                            (char (*) [45])"wasm2js doesn\'t support non-function tables\n");
LAB_00cfb3c7:
          Fatal::~Fatal((Fatal *)local_268);
        }
        pTVar2 = (puVar18->_M_t).
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        local_48 = puVar18;
        if (*(char **)((long)&(pTVar2->super_Importable).module + 8) == (char *)0x0) {
          TableUtils::FlatTable::FlatTable
                    ((FlatTable *)local_268,local_40,
                     (puVar18->_M_t).
                     super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                     super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
          pNVar9 = flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start;
          auVar17 = local_268;
          if ((char)flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == '\x01') {
            for (; pcVar4 = DAT_010d2778, puVar18 = local_48, auVar17 != (undefined1  [8])pNVar9;
                auVar17 = (undefined1  [8])((long)auVar17 + 0x10)) {
              if (((string_view *)auVar17)->_M_str == (char *)0x0) {
                ((string_view *)auVar17)->_M_len = NULL_;
                ((string_view *)auVar17)->_M_str = pcVar4;
              }
              else {
                name_00.super_IString.str._M_str = ((string_view *)auVar17)->_M_str;
                name_00.super_IString.str._M_len = ((string_view *)auVar17)->_M_len;
                sVar20 = (string_view)fromName(local_78,name_00,Top);
                *(string_view *)auVar17 = sVar20;
              }
              sVar3 = ((string_view *)auVar17)->_M_len;
              pcVar4 = ((string_view *)auVar17)->_M_str;
              pvVar16 = (void *)0x18;
              RVar12.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
              (RVar12.inst)->type = Null;
              cashew::Value::free(RVar12.inst,pvVar16);
              (RVar12.inst)->type = String;
              ((RVar12.inst)->field_1).str.str._M_len = sVar3;
              ((RVar12.inst)->field_1).str.str._M_str = pcVar4;
              cashew::ValueBuilder::appendToArray(local_50,RVar12);
            }
          }
          else {
            aVar8 = (((puVar18->_M_t).
                      super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).addr;
            pvVar16 = (void *)0x18;
            pVVar11 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
            pVVar11->type = Null;
            cashew::Value::free(pVVar11,pvVar16);
            pVVar11->type = Number;
            (pVVar11->field_1).num = (double)(uint)aVar8;
            sVar20 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xdd9c3b),
                                       SUB81(in_RCX.inst,0));
            target.str._M_str = (char *)pVVar11;
            target.str._M_len = (size_t)sVar20._M_str;
            RVar12 = cashew::ValueBuilder::makeCall<cashew::Ref>
                               ((ValueBuilder *)sVar20._M_len,target,in_RCX);
            local_50 = cashew::ValueBuilder::makeNew(RVar12);
            local_34 = (uint)CONCAT71((int7)((ulong)local_50.inst >> 8),1);
          }
          if (local_268 != (undefined1  [8])0x0) {
            operator_delete((void *)local_268,
                            (long)flat.names.
                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)local_268);
          }
        }
        else {
          local_34 = (uint)CONCAT71((int7)((ulong)pTVar2 >> 8),1);
        }
        bVar10 = isTableExported(local_40);
        in_RCX.inst = *(Value **)
                       ((long)&(((puVar18->_M_t).
                                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                 .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                               super_Importable).module + 8);
        if (bVar10) {
          if (in_RCX.inst != (Value *)0x0) {
            Fatal::Fatal((Fatal *)local_268);
            Fatal::operator<<((Fatal *)local_268,
                              (char (*) [68])
                              "wasm2js doesn\'t support a table that is both imported and exported\n"
                             );
            goto LAB_00cfb3c7;
          }
          RVar12 = cashew::ValueBuilder::makeVar(false);
          cashew::Value::push_back(local_70,RVar12);
          sVar20 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xe4d073),
                                     SUB81(in_RCX.inst,0));
          target_00.str._M_str = (char *)local_50.inst;
          target_00.str._M_len = (size_t)sVar20._M_str;
          in_RCX = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)sVar20._M_len,target_00,in_RCX);
LAB_00cfaf8f:
          name_02.str._M_str = (char *)in_RCX.inst;
          name_02.str._M_len = (size_t)DAT_010d1358;
          cashew::ValueBuilder::appendToVar
                    ((ValueBuilder *)RVar12.inst,FUNCTION_TABLE,name_02,in_R8);
        }
        else if (in_RCX.inst == (Value *)0x0) {
          RVar12 = cashew::ValueBuilder::makeVar(false);
          cashew::Value::push_back(local_70,RVar12);
          in_RCX.inst = local_50.inst;
          goto LAB_00cfaf8f;
        }
        if ((local_34 & 1) != 0) {
          pcVar4 = *(char **)((long)&(((local_48->_M_t).
                                       super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                       .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                     super_Importable).super_Named + 8);
          if (pcVar4 == (char *)0x0) {
            __assert_fail("table.is() && \"Table name must not be null\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                          ,0x85,
                          "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h:723:29)]"
                         );
          }
          pVVar11 = (Value *)(local_40->elementSegments).
                             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
          for (in_RCX.inst = (Value *)(local_40->elementSegments).
                                      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
              in_RCX.inst != pVVar11; in_RCX.inst = (Value *)&(in_RCX.inst)->field_1) {
            lVar5 = *(long *)in_RCX.inst;
            if (*(char **)(lVar5 + 0x20) == pcVar4) {
              pcVar6 = *(char **)(lVar5 + 0x28);
              bVar10 = wasm::Type::isFunction((Type *)(lVar5 + 0x30));
              if ((bVar10) && (lVar13 = *(long *)(lVar5 + 0x38), *(long *)(lVar5 + 0x40) != lVar13))
              {
                uVar19 = 0;
                do {
                  pcVar7 = *(char **)(lVar13 + uVar19 * 8);
                  if (*pcVar7 == '+') {
                    pVVar14 = *(Value **)(pcVar7 + 0x10);
                    pcVar7 = *(char **)(pcVar7 + 0x18);
                    if (*pcVar6 == '\n') {
                      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                      pcVar15 = pcVar7;
                      local_68 = pVVar14;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_98,*(long *)(pcVar6 + 0x18),
                                 *(long *)(pcVar6 + 0x10) + *(long *)(pcVar6 + 0x18));
                      reuse = SUB81(pcVar15,0);
                      asmangle((string *)local_268,&local_98);
                      auVar17 = local_268;
                      this_00 = (IString *)strlen((char *)local_268);
                      sVar20._M_str = (char *)0x0;
                      sVar20._M_len = (size_t)auVar17;
                      sVar20 = IString::interned(this_00,sVar20,(bool)reuse);
                      pvVar16 = (void *)0x18;
                      pVVar14 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
                      pVVar14->type = Null;
                      cashew::Value::free(pVVar14,pvVar16);
                      pVVar14->type = String;
                      (pVVar14->field_1).str.str = sVar20;
                      sVar3 = DAT_010d1760;
                      RVar12.inst = cashew::PLUS.inst;
                      pvVar16 = (void *)0x18;
                      this_01 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
                      this_01->type = Null;
                      cashew::Value::free(this_01,pvVar16);
                      this_01->type = Number;
                      (this_01->field_1).num = (double)uVar19;
                      op.str._M_str = (char *)this_01;
                      op.str._M_len = sVar3;
                      RVar12 = cashew::ValueBuilder::makeBinary
                                         ((ValueBuilder *)pVVar14,RVar12,op,in_R8);
                      if (local_268 !=
                          (undefined1  [8])
                          &flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                           _M_impl.super__Vector_impl_data._M_finish) {
                        operator_delete((void *)local_268,
                                        (ulong)((long)&((flat.names.
                                                                                                                  
                                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  super_IString).str._M_len + 1));
                      }
                      pVVar14 = local_68;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_98._M_dataplus._M_p != &local_98.field_2) {
                        operator_delete(local_98._M_dataplus._M_p,
                                        local_98.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      if (*pcVar6 != '\x0e') {
                        handle_unreachable("unexpected expr type",
                                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                                           ,0x2e1);
                      }
                      if (*(long *)(pcVar6 + 0x20) != 2) {
                        __assert_fail("type == Type::i32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                                      ,0x120,"int32_t wasm::Literal::geti32() const");
                      }
                      local_68 = (Value *)(double)(uint)(*(int *)(pcVar6 + 0x10) + (int)uVar19);
                      pvVar16 = (void *)0x18;
                      RVar12.inst = (Value *)MixedArena::allocSpace
                                                       ((MixedArena *)cashew::arena,0x18,8);
                      (RVar12.inst)->type = Null;
                      cashew::Value::free(RVar12.inst,pvVar16);
                      (RVar12.inst)->type = Number;
                      ((RVar12.inst)->field_1).num = (double)local_68;
                    }
                    local_68 = FUNCTION_TABLE.inst;
                    pcStack_60 = DAT_010d1358;
                    pvVar16 = (void *)0x18;
                    obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
                    (obj.inst)->type = Null;
                    cashew::Value::free(obj.inst,pvVar16);
                    (obj.inst)->type = String;
                    ((obj.inst)->field_1).str.str._M_len = (size_t)local_68;
                    ((obj.inst)->field_1).str.str._M_str = pcStack_60;
                    local_68 = (Value *)cashew::ValueBuilder::makeSub(obj,RVar12);
                    sVar3 = DAT_010d1a30;
                    RVar12.inst = cashew::SET.inst;
                    name_01.super_IString.str._M_str = pcVar7;
                    name_01.super_IString.str._M_len = (size_t)pVVar14;
                    sVar20 = (string_view)fromName(local_78,name_01,Top);
                    pvVar16 = (void *)0x18;
                    pVVar14 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
                    pVVar14->type = Null;
                    cashew::Value::free(pVVar14,pvVar16);
                    pVVar14->type = String;
                    (pVVar14->field_1).str.str = sVar20;
                    op_00.str._M_str = (char *)pVVar14;
                    op_00.str._M_len = sVar3;
                    RVar12 = cashew::ValueBuilder::makeBinary(local_68,RVar12,op_00,in_R8);
                    cashew::Value::push_back(local_70,RVar12);
                  }
                  uVar19 = (ulong)((int)uVar19 + 1);
                  lVar13 = *(long *)(lVar5 + 0x38);
                } while (uVar19 < (ulong)(*(long *)(lVar5 + 0x40) - lVar13 >> 3));
              }
            }
          }
        }
        puVar18 = local_48 + 1;
      } while (puVar18 != puVar1);
    }
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addTable(Ref ast, Module* wasm) {
  if (wasm->tables.size() == 0) {
    return;
  }

  bool perElementInit = false;

  // Emit a simple flat table as a JS array literal. Otherwise,
  // emit assignments separately for each index.
  Ref theArray = ValueBuilder::makeArray();
  for (auto& table : wasm->tables) {
    if (!table->type.isFunction()) {
      Fatal() << "wasm2js doesn't support non-function tables\n";
    }

    if (!table->imported()) {
      TableUtils::FlatTable flat(*wasm, *table);
      if (flat.valid) {
        for (auto& name : flat.names) {
          if (name.is()) {
            name = fromName(name, NameScope::Top);
          } else {
            name = NULL_;
          }
          ValueBuilder::appendToArray(theArray, ValueBuilder::makeName(name));
        }
      } else {
        perElementInit = true;
        Ref initial =
          ValueBuilder::makeInt(Address::address32_t(table->initial.addr));
        theArray = ValueBuilder::makeNew(
          ValueBuilder::makeCall(IString("Array"), initial));
      }
    } else {
      perElementInit = true;
    }

    if (isTableExported(*wasm)) {
      // If the table is exported use a fake WebAssembly.Table object
      // We don't handle the case where a table is both imported and exported.
      if (table->imported()) {
        Fatal() << "wasm2js doesn't support a table that is both imported and "
                   "exported\n";
      }
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);

      Ref table = ValueBuilder::makeCall(IString("Table"), theArray);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, table);
    } else if (!table->imported()) {
      // Otherwise if the table is internal (neither imported not exported).
      // Just use a plain array in this case, avoiding the Table.
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, theArray);
    }

    if (perElementInit) {
      // TODO: optimize for size
      ModuleUtils::iterTableSegments(
        *wasm, table->name, [&](ElementSegment* segment) {
          auto offset = segment->offset;
          ElementUtils::iterElementSegmentFunctionNames(
            segment, [&](Name entry, Index i) {
              Ref index;
              if (auto* c = offset->dynCast<Const>()) {
                index = ValueBuilder::makeInt(c->value.geti32() + i);
              } else if (auto* get = offset->dynCast<GlobalGet>()) {
                index = ValueBuilder::makeBinary(
                  ValueBuilder::makeName(
                    stringToIString(asmangle(get->name.toString()))),
                  PLUS,
                  ValueBuilder::makeNum(i));
              } else {
                WASM_UNREACHABLE("unexpected expr type");
              }
              ast->push_back(
                ValueBuilder::makeStatement(ValueBuilder::makeBinary(
                  ValueBuilder::makeSub(ValueBuilder::makeName(FUNCTION_TABLE),
                                        index),
                  SET,
                  ValueBuilder::makeName(fromName(entry, NameScope::Top)))));
            });
        });
    }
  }
}